

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O3

void cmdusage(void)

{
  int iVar1;
  long lVar2;
  char *__s;
  
  cmdinfo();
  fprintf(_stderr,"usage: %s [options]\n",cmdname);
  __s = "The following options are supported:\n";
  lVar2 = 1;
  do {
    fputs(__s,_stderr);
    __s = helpinfo[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x14);
  fwrite("The following formats are supported:\n",0x25,1,_stderr);
  lVar2 = jas_image_lookupfmtbyid(0);
  if (lVar2 != 0) {
    iVar1 = 1;
    do {
      fprintf(_stderr,"    %-5s    %s\n",*(undefined8 *)(lVar2 + 8),*(undefined8 *)(lVar2 + 0x18));
      lVar2 = jas_image_lookupfmtbyid(iVar1);
      iVar1 = iVar1 + 1;
    } while (lVar2 != 0);
  }
  exit(1);
}

Assistant:

void cmdusage()
{
	int fmtid;
	const jas_image_fmtinfo_t *fmtinfo;
	const char *s;
	int i;
	cmdinfo();
	fprintf(stderr, "usage: %s [options]\n", cmdname);
	for (i = 0, s = helpinfo[i]; s; ++i, s = helpinfo[i]) {
		fprintf(stderr, "%s", s);
	}
	fprintf(stderr, "The following formats are supported:\n");
	for (fmtid = 0;; ++fmtid) {
		if (!(fmtinfo = jas_image_lookupfmtbyid(fmtid))) {
			break;
		}
		fprintf(stderr, "    %-5s    %s\n", fmtinfo->name,
		  fmtinfo->desc);
	}
	exit(EXIT_FAILURE);
}